

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::IntensityILS::getShuffledCells
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,IntensityILS *this,Station *s)

{
  double dVar1;
  pair<int,_int> in_RAX;
  pair<int,_int> pVar2;
  pair<int,_int> pVar3;
  long lVar4;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar3.first = 0;
  pVar3.second = 0;
  local_38 = in_RAX;
  for (; (long)pVar3 < (long)(s->I).rows_; pVar3 = (pair<int,_int>)((long)pVar3 + 1)) {
    pVar2 = pVar3;
    for (lVar4 = 0; lVar4 < (s->I).cols_; lVar4 = lVar4 + 1) {
      dVar1 = (s->I).p[(long)pVar3][lVar4];
      if ((dVar1 != -1.0) || (NAN(dVar1))) {
        local_38 = pVar2;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&local_38);
      }
      pVar2 = (pair<int,_int>)((long)pVar2 + 0x100000000);
    }
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,int(&)(int)>
            ((__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish,myrandom);
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > IntensityILS::getShuffledCells(Station* s){
		 vector < pair<int, int> > cells;
		 for (int i=0; i<s->I.nb_rows();i++)
			 for (int j=0; j<s->I.nb_cols(); j++)
				 if(s->I(i,j)!=-1) cells.push_back(make_pair(i,j));
		 std::random_shuffle ( cells.begin(), cells.end(), myrandom);
		 return cells;
	 }